

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utilNam.c
# Opt level: O1

void Abc_NamPrint(Abc_Nam_t *p,char *pFileName)

{
  FILE *__stream;
  ulong uVar1;
  
  __stream = _stdout;
  if (pFileName != (char *)0x0) {
    __stream = fopen(pFileName,"wb");
  }
  if (__stream == (FILE *)0x0) {
    printf("Count node open file %s\n",pFileName);
    return;
  }
  if (1 < (p->vInt2Handle).nSize) {
    uVar1 = 1;
    do {
      fprintf(__stream,"%8d = %s\n",uVar1 & 0xffffffff,p->pStore + (p->vInt2Handle).pArray[uVar1]);
      uVar1 = uVar1 + 1;
    } while ((long)uVar1 < (long)(p->vInt2Handle).nSize);
  }
  if (__stream == _stdout) {
    return;
  }
  fclose(__stream);
  return;
}

Assistant:

void Abc_NamPrint( Abc_Nam_t * p, char * pFileName )
{
    FILE * pFile = pFileName ? fopen( pFileName, "wb" ) : stdout;
    int h, i;
    if ( pFile == NULL ) { printf( "Count node open file %s\n", pFileName ); return; }
    Vec_IntForEachEntryStart( &p->vInt2Handle, h, i, 1 )
        fprintf( pFile, "%8d = %s\n", i, Abc_NamHandleToStr(p, h) );
    if ( pFile != stdout )
        fclose(pFile);
}